

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O2

DdNode * Cudd_SubsetCompress(DdManager *dd,DdNode *f,int nvars,int threshold)

{
  int *piVar1;
  DdNode *f_00;
  DdNode *l;
  DdNode *pDVar2;
  
  f_00 = Cudd_SubsetShortPaths(dd,f,nvars,threshold,0);
  if (f_00 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    l = Cudd_RemapUnderApprox(dd,f_00,nvars,0,1.0);
    if (l != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)l & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_IterDerefBdd(dd,f_00);
      pDVar2 = Cudd_bddSqueeze(dd,l,f);
      f_00 = l;
      if (pDVar2 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_IterDerefBdd(dd,l);
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar2;
      }
    }
    Cudd_IterDerefBdd(dd,f_00);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_SubsetCompress(
  DdManager * dd /* manager */,
  DdNode * f /* BDD whose subset is sought */,
  int  nvars /* number of variables in the support of f */,
  int  threshold /* maximum number of nodes in the subset */)
{
    DdNode *res, *tmp1, *tmp2;

    tmp1 = Cudd_SubsetShortPaths(dd, f, nvars, threshold, 0);
    if (tmp1 == NULL) return(NULL);
    cuddRef(tmp1);
    tmp2 = Cudd_RemapUnderApprox(dd,tmp1,nvars,0,1.0);
    if (tmp2 == NULL) {
        Cudd_IterDerefBdd(dd,tmp1);
        return(NULL);
    }
    cuddRef(tmp2);
    Cudd_IterDerefBdd(dd,tmp1);
    res = Cudd_bddSqueeze(dd,tmp2,f);
    if (res == NULL) {
        Cudd_IterDerefBdd(dd,tmp2);
        return(NULL);
    }
    cuddRef(res);
    Cudd_IterDerefBdd(dd,tmp2);
    cuddDeref(res);
    return(res);

}